

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double * multinomial_mean(int a,int b,double *c)

{
  double *pdVar1;
  ulong uVar2;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < b) {
    uVar2 = (long)b * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  if (0 < b) {
    uVar2 = 0;
    do {
      pdVar1[uVar2] = c[uVar2] * (double)a;
      uVar2 = uVar2 + 1;
    } while ((uint)b != uVar2);
  }
  return pdVar1;
}

Assistant:

double *multinomial_mean ( int a, int b, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_MEAN returns the means of the Multinomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of trials.
//
//    Input, int B, the number of outcomes possible on one trial.
//    1 <= B.
//
//    Input, double C(B).  C(I) is the probability of outcome I on
//    any trial.
//    0.0 <= C(I) <= 1.0,
//    SUM ( 1 <= I <= B) C(I) = 1.0.
//
//    Output, double MEAN(B), MEAN(I) is the expected value of the
//    number of outcome I in N trials.
//
{
  int i;
  double *mean;

  mean = new double[b];

  for ( i = 0; i < b; i++ )
  {
    mean[i] = static_cast<double>(a ) * c[i];
  }

  return mean;
}